

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O3

bool cbtGjkEpaSolver2::Penetration
               (cbtConvexShape *shape0,cbtTransform *wtrs0,cbtConvexShape *shape1,
               cbtTransform *wtrs1,cbtVector3 *guess,sResults *results,bool usemargins)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  _ _Var4;
  _ _Var5;
  code *pcVar6;
  long *plVar7;
  ulong uVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [12];
  tShape shape;
  GJK gjk;
  EPA epa;
  float local_7328;
  float fStack_7324;
  float fStack_7320;
  float fStack_731c;
  cbtVector3 local_7310;
  tShape local_7300;
  GJK local_7270;
  EPA local_70a0;
  
  gjkepa2_impl::Initialize(shape0,wtrs0,shape1,wtrs1,results,&local_7300,usemargins);
  local_7270.m_nfree = 0;
  local_7270.m_current = 0;
  local_7270.m_ray.m_floats[0] = 0.0;
  local_7270.m_ray.m_floats[1] = 0.0;
  local_7270.m_ray.m_floats[2] = 0.0;
  local_7270.m_ray.m_floats[3] = 0.0;
  local_7270.m_status = Failed;
  local_7270.m_distance = 0.0;
  auVar10._0_8_ = *(ulong *)guess->m_floats ^ 0x8000000080000000;
  auVar10._8_4_ = 0x80000000;
  auVar10._12_4_ = 0x80000000;
  auVar14._0_4_ = -guess->m_floats[2];
  auVar14._4_4_ = 0x80000000;
  auVar14._8_4_ = 0x80000000;
  auVar14._12_4_ = 0x80000000;
  local_70a0._0_16_ = vinsertps_avx(auVar10,auVar14,0x28);
  _Var4 = gjkepa2_impl::GJK::Evaluate(&local_7270,&local_7300,(cbtVector3 *)&local_70a0);
  if (_Var4 == Failed) {
    results->status = GJK_Failed;
  }
  else if (_Var4 == Inside) {
    local_70a0.m_hull.root = (sFace *)0x0;
    local_70a0.m_hull.count = 0;
    local_70a0.m_stock.root = (sFace *)0x0;
    local_70a0.m_stock.count = 0;
    gjkepa2_impl::EPA::Initialize(&local_70a0);
    auVar11._0_8_ = *(ulong *)guess->m_floats ^ 0x8000000080000000;
    auVar11._8_4_ = 0x80000000;
    auVar11._12_4_ = 0x80000000;
    auVar15._0_4_ = -guess->m_floats[2];
    auVar15._4_4_ = 0x80000000;
    auVar15._8_4_ = 0x80000000;
    auVar15._12_4_ = 0x80000000;
    local_7310.m_floats = (cbtScalar  [4])vinsertps_avx(auVar11,auVar15,0x28);
    _Var5 = gjkepa2_impl::EPA::Evaluate(&local_70a0,&local_7270,&local_7310);
    if (_Var5 != Failed) {
      if (local_70a0.m_result.rank == 0) {
        auVar19 = ZEXT816(0);
        fVar9 = 0.0;
        auVar10 = SUB6416(ZEXT864(0),0);
      }
      else {
        auVar19 = ZEXT816(0);
        fVar9 = 0.0;
        uVar8 = 0;
        do {
          plVar7 = (long *)((long)&(local_7300.m_shapes[0]->super_cbtCollisionShape).
                                   _vptr_cbtCollisionShape + local_7300._136_8_);
          pcVar6 = (code *)local_7300.Ls;
          if ((local_7300.Ls & 1) != 0) {
            pcVar6 = *(code **)(local_7300.Ls + *plVar7 + -1);
          }
          auVar20 = (*pcVar6)(plVar7,*(undefined8 *)
                                      ((long)*(undefined1 (*) [16])&local_70a0 + uVar8 * 8 + 8));
          fVar1 = *(float *)((long)((undefined1 (*) [16])&local_70a0 + 2) + 8U + uVar8 * 4);
          local_7328 = auVar19._0_4_;
          fStack_7324 = auVar19._4_4_;
          fStack_7320 = auVar19._8_4_;
          fStack_731c = auVar19._12_4_;
          uVar8 = uVar8 + 1;
          auVar19._0_4_ = local_7328 + fVar1 * auVar20._0_4_;
          auVar19._4_4_ = fStack_7324 + fVar1 * auVar20._4_4_;
          auVar19._8_4_ = fStack_7320 + fVar1 * (float)extraout_XMM0_Qb;
          auVar19._12_4_ = fStack_731c + fVar1 * (float)((ulong)extraout_XMM0_Qb >> 0x20);
          fVar9 = fVar9 + fVar1 * auVar20._8_4_;
          auVar10 = ZEXT416((uint)fVar9);
        } while (uVar8 < local_70a0.m_result.rank);
        auVar14 = vmovshdup_avx(auVar19);
        fVar9 = auVar14._0_4_;
      }
      results->status = Penetrating;
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * (wtrs0->m_basis).m_el[0].m_floats[1])),
                                auVar19,ZEXT416((uint)(wtrs0->m_basis).m_el[0].m_floats[0]));
      auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * (wtrs0->m_basis).m_el[1].m_floats[1])),
                                auVar19,ZEXT416((uint)(wtrs0->m_basis).m_el[1].m_floats[0]));
      auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * (wtrs0->m_basis).m_el[2].m_floats[1])),
                                auVar19,ZEXT416((uint)(wtrs0->m_basis).m_el[2].m_floats[0]));
      auVar14 = vfmadd231ss_fma(auVar14,auVar10,ZEXT416((uint)(wtrs0->m_basis).m_el[0].m_floats[2]))
      ;
      auVar11 = vfmadd231ss_fma(auVar11,auVar10,ZEXT416((uint)(wtrs0->m_basis).m_el[1].m_floats[2]))
      ;
      auVar15 = vfmadd231ss_fma(auVar15,auVar10,ZEXT416((uint)(wtrs0->m_basis).m_el[2].m_floats[2]))
      ;
      auVar14 = vinsertps_avx(ZEXT416((uint)(auVar14._0_4_ + (wtrs0->m_origin).m_floats[0])),
                              ZEXT416((uint)(auVar11._0_4_ + (wtrs0->m_origin).m_floats[1])),0x10);
      auVar14 = vinsertps_avx(auVar14,ZEXT416((uint)(auVar15._0_4_ + (wtrs0->m_origin).m_floats[2]))
                              ,0x28);
      *(undefined1 (*) [16])results->witnesses[0].m_floats = auVar14;
      fVar1 = auVar10._0_4_ - local_70a0.m_depth * local_70a0.m_normal.m_floats[2];
      auVar18._8_8_ = 0;
      auVar18._0_4_ = local_70a0.m_normal.m_floats[0];
      auVar18._4_4_ = local_70a0.m_normal.m_floats[1];
      auVar10 = vmovshdup_avx(auVar18);
      fVar2 = auVar19._0_4_ - local_70a0.m_normal.m_floats[0] * local_70a0.m_depth;
      fVar9 = fVar9 - local_70a0.m_depth * auVar10._0_4_;
      auVar10 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * (wtrs0->m_basis).m_el[0].m_floats[1])),
                                ZEXT416((uint)fVar2),
                                ZEXT416((uint)(wtrs0->m_basis).m_el[0].m_floats[0]));
      auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * (wtrs0->m_basis).m_el[1].m_floats[1])),
                                ZEXT416((uint)fVar2),
                                ZEXT416((uint)(wtrs0->m_basis).m_el[1].m_floats[0]));
      auVar11 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * (wtrs0->m_basis).m_el[2].m_floats[1])),
                                ZEXT416((uint)fVar2),
                                ZEXT416((uint)(wtrs0->m_basis).m_el[2].m_floats[0]));
      auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)fVar1),
                                ZEXT416((uint)(wtrs0->m_basis).m_el[1].m_floats[2]));
      auVar10 = vfmadd231ss_fma(auVar10,ZEXT416((uint)fVar1),
                                ZEXT416((uint)(wtrs0->m_basis).m_el[0].m_floats[2]));
      auVar11 = vfmadd231ss_fma(auVar11,ZEXT416((uint)fVar1),
                                ZEXT416((uint)(wtrs0->m_basis).m_el[2].m_floats[2]));
      auVar17._24_4_ = 0x80000000;
      auVar17._16_8_ = local_70a0.m_normal.m_floats._0_8_ ^ 0x8000000080000000;
      auVar17._28_4_ = 0x80000000;
      auVar10 = vinsertps_avx(ZEXT416((uint)(auVar10._0_4_ + (wtrs0->m_origin).m_floats[0])),
                              ZEXT416((uint)(auVar14._0_4_ + (wtrs0->m_origin).m_floats[1])),0x10);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
      auVar20 = SUB1612(auVar3 << 0x40,4);
      auVar12._4_12_ = auVar20;
      auVar12._0_4_ = auVar11._0_4_ + (wtrs0->m_origin).m_floats[2];
      auVar16._20_12_ = auVar20;
      auVar16._16_4_ = -local_70a0.m_normal.m_floats[2];
      auVar17._0_16_ = auVar10;
      auVar13._16_16_ = auVar12;
      auVar13._0_16_ = auVar12;
      auVar16._0_16_ = auVar12;
      auVar13 = vperm2f128_avx(auVar13,auVar16,0x31);
      auVar13 = vunpcklpd_avx(auVar17,auVar13);
      *(undefined1 (*) [32])(results->witnesses + 1) = auVar13;
      results->distance = -local_70a0.m_depth;
      return true;
    }
    results->status = EPA_Failed;
  }
  return false;
}

Assistant:

bool cbtGjkEpaSolver2::Penetration(const cbtConvexShape* shape0,
								  const cbtTransform& wtrs0,
								  const cbtConvexShape* shape1,
								  const cbtTransform& wtrs1,
								  const cbtVector3& guess,
								  sResults& results,
								  bool usemargins)
{
	tShape shape;
	Initialize(shape0, wtrs0, shape1, wtrs1, results, shape, usemargins);
	GJK gjk;
	GJK::eStatus::_ gjk_status = gjk.Evaluate(shape, -guess);
	switch (gjk_status)
	{
		case GJK::eStatus::Inside:
		{
			EPA epa;
			EPA::eStatus::_ epa_status = epa.Evaluate(gjk, -guess);
			if (epa_status != EPA::eStatus::Failed)
			{
				cbtVector3 w0 = cbtVector3(0, 0, 0);
				for (U i = 0; i < epa.m_result.rank; ++i)
				{
					w0 += shape.Support(epa.m_result.c[i]->d, 0) * epa.m_result.p[i];
				}
				results.status = sResults::Penetrating;
				results.witnesses[0] = wtrs0 * w0;
				results.witnesses[1] = wtrs0 * (w0 - epa.m_normal * epa.m_depth);
				results.normal = -epa.m_normal;
				results.distance = -epa.m_depth;
				return (true);
			}
			else
				results.status = sResults::EPA_Failed;
		}
		break;
		case GJK::eStatus::Failed:
			results.status = sResults::GJK_Failed;
			break;
		default:
		{
		}
	}
	return (false);
}